

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader.c
# Opt level: O3

int BrotliWarmupBitReader(BrotliBitReader *br)

{
  ulong uVar1;
  int iVar2;
  
  iVar2 = 1;
  if (br->bit_pos_ == 0x40) {
    if (br->avail_in != 0) {
      uVar1 = br->val_;
      br->val_ = uVar1 >> 8;
      br->val_ = (ulong)*br->next_in << 0x38 | uVar1 >> 8;
      br->bit_pos_ = 0x38;
      br->avail_in = br->avail_in - 1;
      br->next_in = br->next_in + 1;
      return 1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

BROTLI_BOOL BrotliWarmupBitReader(BrotliBitReader* const br) {
  size_t aligned_read_mask = (sizeof(br->val_) >> 1) - 1;
  /* Fixing alignment after unaligned BrotliFillWindow would result accumulator
     overflow. If unalignment is caused by BrotliSafeReadBits, then there is
     enough space in accumulator to fix alignment. */
  if (!BROTLI_ALIGNED_READ) {
    aligned_read_mask = 0;
  }
  if (BrotliGetAvailableBits(br) == 0) {
    if (!BrotliPullByte(br)) {
      return BROTLI_FALSE;
    }
  }

  while ((((size_t)br->next_in) & aligned_read_mask) != 0) {
    if (!BrotliPullByte(br)) {
      /* If we consumed all the input, we don't care about the alignment. */
      return BROTLI_TRUE;
    }
  }
  return BROTLI_TRUE;
}